

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeGeneratorPrototype
               (DynamicObject *generatorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  StaticType *type;
  LiteralString *pLVar2;
  JavascriptFunction *pJVar3;
  
  DeferredTypeHandlerBase::Convert(typeHandler,generatorPrototype,mode,5,0);
  this = (((generatorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(generatorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorPrototype,0x67,
             (this->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr,2,0,0,0);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar2 = LiteralString::New(type,L"Generator",9,this->recycler);
    (*(generatorPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (generatorPrototype,0x1b,pLVar2,2,0,0,0);
  }
  pJVar3 = EnsureGeneratorReturnFunction(this);
  (*(generatorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorPrototype,0x135,pJVar3,6,0,0,0);
  pJVar3 = EnsureGeneratorNextFunction(this);
  (*(generatorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorPrototype,0x107,pJVar3,6,0,0,0);
  pJVar3 = EnsureGeneratorThrowFunction(this);
  (*(generatorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorPrototype,0x16a,pJVar3,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(generatorPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorPrototype(DynamicObject* generatorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(generatorPrototype, mode, 5);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterGenerator
        // so that the update is in sync with profiler
        JavascriptLibrary* library = generatorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();

        library->AddMember(generatorPrototype, PropertyIds::constructor, library->generatorFunctionPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled()) {
            library->AddMember(generatorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Generator")), PropertyConfigurable);
        }
        library->AddMember(generatorPrototype, PropertyIds::return_, library->EnsureGeneratorReturnFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(generatorPrototype, PropertyIds::next, library->EnsureGeneratorNextFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(generatorPrototype, PropertyIds::throw_, library->EnsureGeneratorThrowFunction(), PropertyBuiltInMethodDefaults);

        generatorPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }